

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

void GF2::Env::RandMem(void *pMem,size_t size)

{
  u32 uVar1;
  undefined8 in_RAX;
  u32 *__dest;
  ulong uVar2;
  undefined4 uStack_28;
  u32 rnd;
  
  if (size != 0) {
    _uStack_28 = in_RAX;
    for (uVar2 = 1; uVar2 < size >> 2; uVar2 = uVar2 + 1) {
      uVar1 = Rand();
      *(u32 *)((long)pMem + uVar2 * 4 + -4) = uVar1;
    }
    uVar1 = Rand();
    _uStack_28 = CONCAT44(uVar1,uStack_28);
    __dest = (u32 *)((long)pMem + uVar2 * 4 + -4);
    if ((size & 3) == 0) {
      *__dest = uVar1;
    }
    else {
      memcpy(__dest,&rnd,size & 3);
    }
  }
  return;
}

Assistant:

void Env::RandMem(void* pMem, size_t size)
{
	if (size == 0) return;
	u32* pMem32 = (u32*)pMem;
	// заполняем все слова, кроме последнего (возможно неполного)
	for (size_t i = 0; i + 1 < size / 4; *(pMem32++) = Rand(), ++i);
	// заполняем последнее слово
	u32 rnd = Rand();
	if (size %= 4)
		::memcpy(pMem32, &rnd, size);
	else
		*pMem32 = rnd;
}